

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::match(Parser *this,token t)

{
  DatalogProgram *this_00;
  runtime_error *this_01;
  reference ptVar1;
  bool local_79;
  __normal_iterator<tok_*,_std::vector<tok,_std::allocator<tok>_>_> local_58;
  tok *local_50;
  string local_48 [52];
  token local_14;
  Parser *pPStack_10;
  token t_local;
  Parser *this_local;
  
  local_14 = t;
  pPStack_10 = this;
  if (t == (this->curr).t) {
    if (t == STRING) {
      this_00 = this->prog;
      std::__cxx11::string::string(local_48,(string *)&(this->curr).s);
      DatalogProgram::add_dom_str(this_00,(string *)local_48);
      std::__cxx11::string::~string(local_48);
    }
    local_50 = (tok *)__gnu_cxx::__normal_iterator<tok_*,_std::vector<tok,_std::allocator<tok>_>_>::
                      operator++(&this->it,0);
    local_79 = true;
    if (local_14 != END_FILE) {
      local_58._M_current = (tok *)std::vector<tok,_std::allocator<tok>_>::end(&this->toks);
      local_79 = __gnu_cxx::operator==(&this->it,&local_58);
    }
    if (local_79 == false) {
      ptVar1 = __gnu_cxx::__normal_iterator<tok_*,_std::vector<tok,_std::allocator<tok>_>_>::
               operator*(&this->it);
      tok::operator=(&this->curr,ptVar1);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Tokens don\'t match.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::match(token t)
{
//	print_tok(curr,cout);
//	cout << s->tok_string(t) << endl;
	if (t != curr.t) throw runtime_error("Tokens don't match.");
	if (t == STRING) prog->add_dom_str(curr.s);
	it++;
	if (t==END_FILE || it == toks.end()) return;
	curr = *it;
}